

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::UnionNodes
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node *prev,Node *curr)

{
  Char kc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar2;
  MatchSetNode *currSet_1;
  MatchCharNode *currChar_1;
  MatchSetNode *prevSet;
  TrackAllocData local_b0;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_88;
  MatchSetNode *setNode_1;
  MatchSetNode *currSet;
  undefined8 local_70;
  TrackAllocData local_68;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_40;
  MatchSetNode *setNode;
  MatchCharNode *currChar;
  MatchCharNode *prevChar;
  Node *curr_local;
  Node *prev_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  prevChar = (MatchCharNode *)curr;
  curr_local = prev;
  prev_local = (Node *)this;
  this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)prev;
  if (prev->tag == MatchChar) {
    currChar = (MatchCharNode *)prev;
    if (curr->tag == MatchChar) {
      if (*(short *)&prev[1]._vptr_Node != *(short *)&curr[1]._vptr_Node) {
        pAVar1 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        setNode = (MatchSetNode *)curr;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_68,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x288);
        pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar1,&local_68);
        currSet = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_70 = 0;
        pPVar2 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                 new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar1,0x3f67b0);
        MatchSetNode::MatchSetNode((MatchSetNode *)pPVar2,false,true);
        local_40 = pPVar2;
        CharSet<char16_t>::Set
                  ((CharSet<char16_t> *)&pPVar2->inputLim,this->ctAllocator,currChar->cs[0]);
        kc._0_1_ = setNode->isNegation;
        kc._1_1_ = setNode->needsEquivClass;
        CharSet<char16_t>::Set((CharSet<char16_t> *)&local_40->inputLim,this->ctAllocator,kc);
        this_local = local_40;
      }
    }
    else if (curr->tag == MatchSet) {
      if (((ulong)curr[1]._vptr_Node & 1) == 0) {
        pAVar1 = &this->ctAllocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        setNode_1 = (MatchSetNode *)curr;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b0,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x297);
        pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar1,&local_b0);
        pPVar2 = (Parser<UTF8EncodingPolicyBase<false>,_false> *)
                 new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar1,0x3f67b0);
        MatchSetNode::MatchSetNode((MatchSetNode *)pPVar2,false,true);
        local_88 = pPVar2;
        CharSet<char16_t>::Set
                  ((CharSet<char16_t> *)&pPVar2->inputLim,this->ctAllocator,currChar->cs[0]);
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)&local_88->inputLim,this->ctAllocator,&setNode_1->set);
        this_local = local_88;
      }
      else {
        this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
      }
    }
    else {
      this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
    }
  }
  else if (prev->tag == MatchSet) {
    if (((ulong)prev[1]._vptr_Node & 1) == 0) {
      if (curr->tag == MatchChar) {
        CharSet<char16_t>::Set
                  ((CharSet<char16_t> *)&prev[1].tag,this->ctAllocator,*(Char *)&curr[1]._vptr_Node)
        ;
      }
      else if (curr->tag == MatchSet) {
        if (((ulong)curr[1]._vptr_Node & 1) == 0) {
          CharSet<char16_t>::UnionInPlace
                    ((CharSet<char16_t> *)&prev[1].tag,this->ctAllocator,
                     (CharSet<char16_t> *)&curr[1].tag);
        }
        else {
          this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
        }
      }
      else {
        this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
      }
    }
    else {
      this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
    }
  }
  else {
    this_local = (Parser<UTF8EncodingPolicyBase<false>,_false> *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node* Parser<P, IsLiteral>::UnionNodes(Node* prev, Node* curr)
    {
        if (prev->tag == Node::MatchChar)
        {
            MatchCharNode* prevChar = (MatchCharNode*)prev;
            if (curr->tag == Node::MatchChar)
            {
                MatchCharNode* currChar = (MatchCharNode*)curr;
                if (prevChar->cs[0] == currChar->cs[0])
                    // Just ignore current node
                    return prevChar;
                else
                {
                    // Union chars into new set
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false);
                    setNode->set.Set(ctAllocator, prevChar->cs[0]);
                    setNode->set.Set(ctAllocator, currChar->cs[0]);
                    return setNode;
                }
            }
            else if (curr->tag == Node::MatchSet)
            {
                MatchSetNode* currSet = (MatchSetNode*)curr;
                if (currSet->isNegation)
                    // Can't merge
                    return 0;
                else
                {
                    // Union chars into new set
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false);
                    setNode->set.Set(ctAllocator, prevChar->cs[0]) ;
                    setNode->set.UnionInPlace(ctAllocator, currSet->set);
                    return setNode;
                }
            }
            else
                // Can't merge
                return 0;
        }
        else if (prev->tag == Node::MatchSet)
        {
            MatchSetNode* prevSet = (MatchSetNode*)prev;
            if (prevSet->isNegation)
                // Can't merge
                return 0;
            else if (curr->tag == Node::MatchChar)
            {
                MatchCharNode* currChar = (MatchCharNode*)curr;
                // Include char in prev set
                prevSet->set.Set(ctAllocator, currChar->cs[0]);
                return prevSet;
            }
            else if (curr->tag == Node::MatchSet)
            {
                MatchSetNode* currSet = (MatchSetNode*)curr;
                if (currSet->isNegation)
                    // Can't merge
                    return 0;
                else
                {
                    // Include chars in prev set
                    prevSet->set.UnionInPlace(ctAllocator, currSet->set);
                    return prevSet;
                }
            }
            else
                // Can't merge
                return 0;
        }
        else
            // Can't merge
            return 0;
    }